

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_readline(lua_State *L)

{
  int iVar1;
  undefined8 *puVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int local_24;
  int n;
  int i;
  LStream *p;
  lua_State *L_local;
  
  puVar2 = (undefined8 *)lua_touserdata(L,-0xf4629);
  lVar3 = lua_tointegerx(L,-0xf462a,(int *)0x0);
  if (puVar2[1] == 0) {
    L_local._4_4_ = luaL_error(L,"file is already closed");
  }
  else {
    lua_settop(L,1);
    for (local_24 = 1; local_24 <= (int)lVar3; local_24 = local_24 + 1) {
      lua_pushvalue(L,-0xf4628 - (local_24 + 3));
    }
    L_local._4_4_ = g_read(L,(FILE *)*puVar2,2);
    iVar1 = lua_type(L,-L_local._4_4_);
    if (iVar1 == 0) {
      if (L_local._4_4_ < 2) {
        iVar1 = lua_toboolean(L,-0xf462b);
        if (iVar1 != 0) {
          lua_settop(L,0);
          lua_pushvalue(L,-0xf4629);
          aux_close(L);
        }
        L_local._4_4_ = 0;
      }
      else {
        pcVar4 = lua_tolstring(L,1 - L_local._4_4_,(size_t *)0x0);
        L_local._4_4_ = luaL_error(L,"%s",pcVar4);
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int io_readline (lua_State *L) {
  LStream *p = (LStream *)lua_touserdata(L, lua_upvalueindex(1));
  int i;
  int n = (int)lua_tointeger(L, lua_upvalueindex(2));
  if (isclosed(p))  /* file is already closed? */
    return luaL_error(L, "file is already closed");
  lua_settop(L , 1);
  for (i = 1; i <= n; i++)  /* push arguments to 'g_read' */
    lua_pushvalue(L, lua_upvalueindex(3 + i));
  n = g_read(L, p->f, 2);  /* 'n' is number of results */
  lua_assert(n > 0);  /* should return at least a nil */
  if (!lua_isnil(L, -n))  /* read at least one value? */
    return n;  /* return them */
  else {  /* first result is nil: EOF or error */
    if (n > 1) {  /* is there error information? */
      /* 2nd result is error message */
      return luaL_error(L, "%s", lua_tostring(L, -n + 1));
    }
    if (lua_toboolean(L, lua_upvalueindex(3))) {  /* generator created file? */
      lua_settop(L, 0);
      lua_pushvalue(L, lua_upvalueindex(1));
      aux_close(L);  /* close it */
    }
    return 0;
  }
}